

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O2

void __thiscall glslang::TSymbolTable::copyTable(TSymbolTable *this,TSymbolTable *copyOf)

{
  pointer ppTVar1;
  int iVar2;
  uint uVar3;
  TSymbolTableLevel *in_RAX;
  undefined4 extraout_var;
  ulong uVar4;
  void *in_RDX;
  void *extraout_RDX;
  TSymbolTable *__fn;
  void *in_R8;
  TSymbolTableLevel *local_28;
  
  uVar3 = this->adoptedLevels;
  if (uVar3 == copyOf->adoptedLevels) {
    this->uniqueId = copyOf->uniqueId;
    this->noBuiltInRedeclarations = copyOf->noBuiltInRedeclarations;
    this->separateNameSpaces = copyOf->separateNameSpaces;
    __fn = copyOf;
    local_28 = in_RAX;
    while( true ) {
      ppTVar1 = (copyOf->table).
                super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = (long)(copyOf->table).
                    super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3;
      if (uVar4 <= uVar3) break;
      iVar2 = TSymbolTableLevel::clone(ppTVar1[uVar3],(__fn *)__fn,in_RDX,(int)uVar4,in_R8);
      local_28 = (TSymbolTableLevel *)CONCAT44(extraout_var,iVar2);
      __fn = (TSymbolTable *)&local_28;
      std::vector<glslang::TSymbolTableLevel*,std::allocator<glslang::TSymbolTableLevel*>>::
      emplace_back<glslang::TSymbolTableLevel*>
                ((vector<glslang::TSymbolTableLevel*,std::allocator<glslang::TSymbolTableLevel*>> *)
                 this,&local_28);
      uVar3 = uVar3 + 1;
      in_RDX = extraout_RDX;
    }
    return;
  }
  __assert_fail("adoptedLevels == copyOf.adoptedLevels",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SymbolTable.cpp"
                ,0x1eb,"void glslang::TSymbolTable::copyTable(const TSymbolTable &)");
}

Assistant:

void TSymbolTable::copyTable(const TSymbolTable& copyOf)
{
    assert(adoptedLevels == copyOf.adoptedLevels);

    uniqueId = copyOf.uniqueId;
    noBuiltInRedeclarations = copyOf.noBuiltInRedeclarations;
    separateNameSpaces = copyOf.separateNameSpaces;
    for (unsigned int i = copyOf.adoptedLevels; i < copyOf.table.size(); ++i)
        table.push_back(copyOf.table[i]->clone());
}